

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rasterizing.cpp
# Opt level: O2

Matrix * lookat(Matrix *__return_storage_ptr__,Vec3f *eye,Vec3f *center,Vec3f *up)

{
  float fVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  vector<float,_std::allocator<float>_> *pvVar6;
  long lVar7;
  long lVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float local_78;
  Vec3<float> local_40;
  float local_34;
  float local_30;
  float local_2c;
  
  local_40.z = eye->z - center->z;
  uVar2 = eye->x;
  uVar4 = eye->y;
  uVar3 = center->x;
  uVar5 = center->y;
  local_40.x = (float)uVar2 - (float)uVar3;
  fVar9 = (float)uVar4 - (float)uVar5;
  local_40.y = 1.0 / SQRT(local_40.z * local_40.z + local_40.x * local_40.x + fVar9 * fVar9);
  local_40.z = local_40.z * local_40.y;
  local_40.x = local_40.y * local_40.x;
  local_40.y = local_40.y * fVar9;
  Vec3<float>::operator^(up,&local_40);
  fVar9 = 1.0 / SQRT(local_2c * local_2c + local_34 * local_34 + local_30 * local_30);
  fVar10 = local_2c * fVar9;
  fVar11 = local_30 * fVar9;
  fVar9 = fVar9 * local_34;
  fVar13 = local_40.y * fVar10 - fVar11 * local_40.z;
  fVar14 = local_40.z * fVar9 - fVar10 * local_40.x;
  fVar12 = local_40.x * fVar11 - fVar9 * local_40.y;
  Matrix::identity(__return_storage_ptr__,4);
  for (lVar8 = -3; lVar8 != 0; lVar8 = lVar8 + 1) {
    local_78 = fVar9;
    if ((lVar8 != -3) && (local_78 = fVar11, lVar8 != -2)) {
      local_78 = fVar10;
    }
    pvVar6 = Matrix::operator[](__return_storage_ptr__,0);
    (pvVar6->super__Vector_base<float,_std::allocator<float>_>)._M_impl.super__Vector_impl_data.
    _M_start[lVar8 + 3] = local_78;
    local_78 = fVar13;
    if ((lVar8 != -3) && (local_78 = fVar14, lVar8 != -2)) {
      local_78 = fVar12;
    }
    pvVar6 = Matrix::operator[](__return_storage_ptr__,1);
    (pvVar6->super__Vector_base<float,_std::allocator<float>_>)._M_impl.super__Vector_impl_data.
    _M_start[lVar8 + 3] =
         local_78 * (1.0 / SQRT(fVar12 * fVar12 + fVar13 * fVar13 + fVar14 * fVar14));
    lVar7 = 0;
    if (lVar8 != -3) {
      lVar7 = (ulong)(lVar8 != -2) * 4 + 4;
    }
    fVar1 = *(float *)((long)&local_40.x + lVar7);
    pvVar6 = Matrix::operator[](__return_storage_ptr__,2);
    (pvVar6->super__Vector_base<float,_std::allocator<float>_>)._M_impl.super__Vector_impl_data.
    _M_start[lVar8 + 3] = fVar1;
    lVar7 = 0;
    if (lVar8 != -3) {
      lVar7 = (ulong)(lVar8 != -2) * 4 + 4;
    }
    fVar1 = *(float *)((long)&center->x + lVar7);
    pvVar6 = Matrix::operator[](__return_storage_ptr__,(int)lVar8 + 3);
    (pvVar6->super__Vector_base<float,_std::allocator<float>_>)._M_impl.super__Vector_impl_data.
    _M_start[3] = -fVar1;
  }
  return __return_storage_ptr__;
}

Assistant:

Matrix lookat(Vec3f eye, Vec3f center, Vec3f up) {
    Vec3f z = (eye-center).normalize();
    Vec3f x = (up^z).normalize();
    Vec3f y = (z^x).normalize();
    Matrix ret = Matrix::identity(4);
    for (int i=0; i<3; i++) {
        ret[0][i] = x[i];
        ret[1][i] = y[i];
        ret[2][i] = z[i];
        ret[i][3] = -center[i];
    }
    return ret;
}